

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.hpp
# Opt level: O2

void diy::
     Serialization<std::vector<diy::AMRLink::Description,_std::allocator<diy::AMRLink::Description>_>_>
     ::load(BinaryBuffer *bb,Vector *v)

{
  size_t __new_size;
  size_t s;
  Description local_168;
  
  (*bb->_vptr_BinaryBuffer[4])(bb,&s,8);
  __new_size = s;
  memset(&local_168,0,0x148);
  AMRLink::Description::Description(&local_168);
  Catch::clara::std::vector<diy::AMRLink::Description,_std::allocator<diy::AMRLink::Description>_>::
  resize(v,__new_size,&local_168);
  AMRLink::Description::~Description(&local_168);
  if (s != 0) {
    load<diy::AMRLink::Description>
              (bb,(v->
                  super__Vector_base<diy::AMRLink::Description,_std::allocator<diy::AMRLink::Description>_>
                  )._M_impl.super__Vector_impl_data._M_start,s);
  }
  return;
}

Assistant:

static void         load(BinaryBuffer& bb, Vector& v)
    {
      size_t s;
      diy::load(bb, s);
      v.resize(s, U());
      if (s > 0)
        diy::load(bb, &v[0], s);
    }